

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLevelSampleResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,FilterMode filterMode,
               LookupPrecision *prec,Vec3 *coord,Vec4 *result)

{
  bool bVar1;
  TextureChannelClass TVar2;
  int iVar3;
  int iVar4;
  int c;
  int iVar5;
  int x1;
  int y0;
  int y1;
  int z;
  int z_00;
  uint uVar6;
  int iVar7;
  int c_00;
  int j;
  int iVar8;
  int i;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar20 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float s;
  bool local_2c5;
  float a;
  float local_288;
  Vec2 local_1b8;
  Vec2 wBounds;
  Vec2 vBounds;
  Vec2 uBounds;
  Vec4 c0;
  tcu local_160 [16];
  tcu local_150 [16];
  tcu local_140 [16];
  tcu local_130 [16];
  tcu local_120 [16];
  Vec4 c1;
  ColorQuad quad1;
  ColorQuad quad0;
  tcu local_80 [16];
  tcu local_70 [16];
  tcu local_60 [16];
  tcu local_50 [16];
  tcu local_40 [16];
  
  if (filterMode == LINEAR) {
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&uBounds,sampler->normalizedCoords,(level->m_size).m_data[0],
               coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&vBounds,sampler->normalizedCoords,(level->m_size).m_data[1],
               coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&wBounds,sampler->normalizedCoords,(level->m_size).m_data[2],
               coord->m_data[2],(prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
    fVar10 = floorf(uBounds.m_data[0] + -0.5);
    fVar11 = floorf(uBounds.m_data[1] + -0.5);
    fVar12 = floorf(vBounds.m_data[0] + -0.5);
    fVar13 = floorf(vBounds.m_data[1] + -0.5);
    fVar14 = floorf(wBounds.m_data[0] + -0.5);
    fVar15 = floorf(wBounds.m_data[1] + -0.5);
    iVar7 = (level->m_size).m_data[0];
    iVar8 = (level->m_size).m_data[1];
    iVar9 = (level->m_size).m_data[2];
    TVar2 = getTextureChannelClass((level->m_format).type);
    if (TVar2 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      fVar16 = computeBilinearSearchStepForSnorm(prec);
    }
    else {
      fVar16 = 0.0;
      if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
        fVar16 = computeBilinearSearchStepForUnorm(prec);
      }
    }
    iVar5 = (int)fVar14;
    while (iVar3 = iVar5, local_2c5 = iVar3 <= (int)fVar15, iVar3 <= (int)fVar15) {
      fVar14 = (float)iVar3;
      iVar5 = (int)fVar12;
      while (iVar4 = iVar5, iVar5 = iVar3 + 1, iVar4 <= (int)fVar13) {
        c = (int)fVar10;
        while (iVar5 = iVar4 + 1, c <= (int)fVar11) {
          iVar5 = TexVerifierUtil::wrap(sampler->wrapS,c,iVar7);
          c_00 = c + 1;
          x1 = TexVerifierUtil::wrap(sampler->wrapS,c_00,iVar7);
          y0 = TexVerifierUtil::wrap(sampler->wrapT,iVar4,iVar8);
          y1 = TexVerifierUtil::wrap(sampler->wrapT,iVar4 + 1,iVar8);
          z = TexVerifierUtil::wrap(sampler->wrapR,iVar3,iVar9);
          z_00 = TexVerifierUtil::wrap(sampler->wrapR,iVar3 + 1,iVar9);
          fVar18 = wBounds.m_data[1];
          fVar25 = wBounds.m_data[0];
          fVar17 = (vBounds.m_data[0] + -0.5) - (float)iVar4;
          fVar21 = (vBounds.m_data[1] + -0.5) - (float)iVar4;
          fVar22 = (uBounds.m_data[0] + -0.5) - (float)c;
          fVar23 = (uBounds.m_data[1] + -0.5) - (float)c;
          auVar20._4_4_ = -(uint)(fVar21 < 0.0);
          auVar20._0_4_ = -(uint)(fVar17 < 0.0);
          auVar20._8_4_ = -(uint)(fVar22 < 0.0);
          auVar20._12_4_ = -(uint)(fVar23 < 0.0);
          uVar6 = movmskps(z_00,auVar20);
          fVar19 = 0.0;
          if (((uVar6 & 4) == 0) && (fVar19 = 1.0, fVar22 <= 1.0)) {
            fVar19 = fVar22;
          }
          fVar22 = 0.0;
          if (((uVar6 & 8) == 0) && (fVar22 = 1.0, fVar23 <= 1.0)) {
            fVar22 = fVar23;
          }
          local_288 = 0.0;
          if (((uVar6 & 1) == 0) && (local_288 = 1.0, fVar17 <= 1.0)) {
            local_288 = fVar17;
          }
          fVar17 = 0.0;
          if (((uVar6 & 2) == 0) && (fVar17 = 1.0, fVar21 <= 1.0)) {
            fVar17 = fVar21;
          }
          ColorQuad::ColorQuad(&quad0);
          ColorQuad::ColorQuad(&quad1);
          lookupQuad(&quad0,level,sampler,iVar5,x1,y0,y1,z);
          lookupQuad(&quad1,level,sampler,iVar5,x1,y0,y1,z_00);
          if (TVar2 == TEXTURECHANNELCLASS_FLOATING_POINT) {
            fVar16 = computeBilinearSearchStepFromFloatQuad(prec,&quad0);
            fVar21 = computeBilinearSearchStepFromFloatQuad(prec,&quad1);
            fVar16 = (float)(~-(uint)(fVar16 <= fVar21) & (uint)fVar21 |
                            (uint)fVar16 & -(uint)(fVar16 <= fVar21));
          }
          auVar24._0_4_ = (fVar25 + -0.5) - fVar14;
          auVar24._4_4_ = (fVar18 + -0.5) - fVar14;
          auVar24._8_4_ = 0.0 - fVar14;
          auVar24._12_4_ = 0.0 - fVar14;
          auVar20 = minps(_DAT_00963870,auVar24);
          local_1b8.m_data[0] = (float)(-(uint)(0.0 <= auVar24._0_4_) & auVar20._0_4_);
          local_1b8.m_data[1] = (float)(-(uint)(0.0 <= auVar24._4_4_) & auVar20._4_4_);
          bVar1 = isInColorBounds(prec,&quad0,&quad1,result);
          c = c_00;
          if (bVar1) {
            for (; fVar19 < fVar22 + fVar16; fVar19 = fVar19 + fVar16) {
              fVar21 = (float)(~-(uint)(fVar19 <= fVar22) & (uint)fVar22 |
                              -(uint)(fVar19 <= fVar22) & (uint)fVar19);
              fVar18 = 1.0 - fVar21;
              for (fVar25 = local_288; fVar25 < fVar17 + fVar16; fVar25 = fVar25 + fVar16) {
                s = (float)(~-(uint)(fVar25 <= fVar17) & (uint)fVar17 |
                           -(uint)(fVar25 <= fVar17) & (uint)fVar25);
                operator*(local_140,fVar18,&quad0.p00);
                fVar23 = 1.0 - s;
                operator*(local_130,fVar23,(Vector<float,_4> *)local_140);
                operator*(local_150,fVar21,&quad0.p10);
                operator*(local_40,fVar23,(Vector<float,_4> *)local_150);
                operator+(local_120,(Vector<float,_4> *)local_130,(Vector<float,_4> *)local_40);
                operator*(local_160,fVar18,&quad0.p01);
                operator*(local_50,s,(Vector<float,_4> *)local_160);
                operator+((tcu *)&c1,(Vector<float,_4> *)local_120,(Vector<float,_4> *)local_50);
                operator*(local_70,fVar21,&quad0.p11);
                operator*(local_60,s,(Vector<float,_4> *)local_70);
                operator+((tcu *)&c0,(Vector<float,_4> *)&c1,(Vector<float,_4> *)local_60);
                operator*(local_40,fVar18,&quad1.p00);
                operator*(local_140,fVar23,(Vector<float,_4> *)local_40);
                operator*(local_50,fVar21,&quad1.p10);
                operator*(local_150,fVar23,(Vector<float,_4> *)local_50);
                operator+(local_130,(Vector<float,_4> *)local_140,(Vector<float,_4> *)local_150);
                operator*(local_60,fVar18,&quad1.p01);
                operator*(local_160,s,(Vector<float,_4> *)local_60);
                operator+(local_120,(Vector<float,_4> *)local_130,(Vector<float,_4> *)local_160);
                operator*(local_80,fVar21,&quad1.p11);
                operator*(local_70,s,(Vector<float,_4> *)local_80);
                operator+((tcu *)&c1,(Vector<float,_4> *)local_120,(Vector<float,_4> *)local_70);
                bVar1 = isLinearRangeValid(prec,&c0,&c1,&local_1b8,result);
                if (bVar1) {
                  return local_2c5;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&quad1,sampler->normalizedCoords,(level->m_size).m_data[0],
               coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&c0,sampler->normalizedCoords,(level->m_size).m_data[1],
               coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&c1,sampler->normalizedCoords,(level->m_size).m_data[2],
               coord->m_data[2],(prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
    fVar10 = floorf(quad1.p00.m_data[0]);
    fVar11 = floorf(quad1.p00.m_data[1]);
    fVar12 = floorf(c0.m_data[0]);
    fVar13 = floorf(c0.m_data[1]);
    fVar14 = floorf(c1.m_data[0]);
    fVar15 = floorf(c1.m_data[1]);
    for (iVar7 = (int)fVar14; local_2c5 = iVar7 <= (int)fVar15, iVar8 = (int)fVar12,
        iVar7 <= (int)fVar15; iVar7 = iVar7 + 1) {
      for (; iVar9 = (int)fVar10, iVar8 <= (int)fVar13; iVar8 = iVar8 + 1) {
        while (iVar9 <= (int)fVar11) {
          iVar5 = TexVerifierUtil::wrap(sampler->wrapS,iVar9,(level->m_size).m_data[0]);
          iVar3 = TexVerifierUtil::wrap(sampler->wrapT,iVar8,(level->m_size).m_data[1]);
          iVar4 = TexVerifierUtil::wrap(sampler->wrapR,iVar7,(level->m_size).m_data[2]);
          lookup<float>((tcu *)&quad0,level,sampler,iVar5,iVar3,iVar4);
          bVar1 = isColorValid(prec,&quad0.p00,result);
          iVar9 = iVar9 + 1;
          if (bVar1) {
            return local_2c5;
          }
        }
      }
    }
  }
  return local_2c5;
}

Assistant:

static bool isLevelSampleResultValid (const ConstPixelBufferAccess&		level,
									  const Sampler&					sampler,
									  const Sampler::FilterMode			filterMode,
									  const LookupPrecision&			prec,
									  const Vec3&						coord,
									  const Vec4&						result)
{
	if (filterMode == Sampler::LINEAR)
		return isLinearSampleResultValid(level, sampler, prec, coord, result);
	else
		return isNearestSampleResultValid(level, sampler, prec, coord, result);
}